

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O0

void __thiscall phoenix_flm_t::flm_entry_t::~flm_entry_t(flm_entry_t *this)

{
  flm_entry_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__flm_entry_t_0037b1b0;
  _clean_up(this);
  std::__cxx11::string::~string((string *)&this->m_guid);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

phoenix_flm_t::flm_entry_t::~flm_entry_t() {
    _clean_up();
}